

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::Trim(ON_NurbsCurve *this,ON_Interval *in)

{
  double dVar1;
  uint order;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  uint hint;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double split_t;
  ON_Interval local_40;
  
  bVar3 = ON_Interval::IsIncreasing(in);
  bVar11 = false;
  if (bVar3) {
    iVar12 = 0;
    if (0 < this->m_dim) {
      iVar12 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    }
    order = this->m_order;
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    bVar3 = ON_Interval::operator==(in,&local_40);
    bVar11 = true;
    if (!bVar3) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      dVar1 = in->m_t[1];
      iVar4 = ON_NurbsSpanIndex(order,this->m_cv_count,this->m_knot,dVar1,-1,0);
      pdVar7 = this->m_knot;
      local_40.m_t[0] = dVar1;
      bVar3 = TweakSplitTrimParameter
                        (pdVar7[(long)(int)(iVar4 + order) + -2],
                         pdVar7[(long)(int)(iVar4 + order) + -1],local_40.m_t);
      if (bVar3) {
        iVar4 = ON_NurbsSpanIndex(order,this->m_cv_count,pdVar7,local_40.m_t[0],-1,iVar4);
        pdVar7 = this->m_knot;
      }
      pdVar6 = this->m_cv + this->m_cv_stride * iVar4;
      if (this->m_cv == (double *)0x0) {
        pdVar6 = (double *)0x0;
      }
      bVar3 = ON_EvaluateNurbsDeBoor
                        (iVar12,order,this->m_cv_stride,pdVar6,pdVar7 + iVar4,-1,0.0,dVar1);
      if (bVar3) {
        this->m_cv_count = iVar4 + order;
        iVar5 = ON_KnotCount(order,iVar4 + order);
        auVar15 = _DAT_0069b170;
        auVar2 = _DAT_0069b120;
        iVar4 = this->m_cv_count;
        pdVar7 = this->m_knot;
        if (iVar4 <= iVar5) {
          lVar8 = (long)iVar5;
          pdVar6 = pdVar7 + lVar8 + -1;
          lVar9 = lVar8 - iVar4;
          auVar13._8_4_ = (int)lVar9;
          auVar13._0_8_ = lVar9;
          auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
          uVar10 = 0;
          auVar13 = auVar13 ^ _DAT_0069b120;
          do {
            auVar16._8_4_ = (int)uVar10;
            auVar16._0_8_ = uVar10;
            auVar16._12_4_ = (int)(uVar10 >> 0x20);
            auVar16 = (auVar16 | auVar15) ^ auVar2;
            if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                        auVar13._4_4_ < auVar16._4_4_) & 1)) {
              *pdVar6 = dVar1;
            }
            if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
                auVar16._12_4_ <= auVar13._12_4_) {
              pdVar6[-1] = dVar1;
            }
            uVar10 = uVar10 + 2;
            pdVar6 = pdVar6 + -2;
          } while (((lVar8 - iVar4) + 2U & 0xfffffffffffffffe) != uVar10);
        }
        dVar1 = in->m_t[0];
        hint = ON_NurbsSpanIndex(order,iVar4,pdVar7,dVar1,1,0);
        pdVar7 = this->m_knot;
        local_40.m_t[0] = dVar1;
        bVar3 = TweakSplitTrimParameter
                          (pdVar7[(long)(int)(hint + order) + -2],
                           pdVar7[(long)(int)(hint + order) + -1],local_40.m_t);
        if (bVar3) {
          hint = ON_NurbsSpanIndex(order,this->m_cv_count,pdVar7,local_40.m_t[0],1,hint);
          pdVar7 = this->m_knot;
        }
        pdVar6 = this->m_cv + (int)(this->m_cv_stride * hint);
        if (this->m_cv == (double *)0x0) {
          pdVar6 = (double *)0x0;
        }
        bVar3 = ON_EvaluateNurbsDeBoor
                          (iVar12,order,this->m_cv_stride,pdVar6,pdVar7 + (int)hint,1,0.0,dVar1);
        if (bVar3) {
          if (0 < (int)hint) {
            iVar12 = this->m_cv_count;
            iVar4 = this->m_cv_stride;
            if ((int)(iVar4 * hint) < iVar4 * iVar12) {
              pdVar7 = this->m_cv;
              uVar10 = (ulong)(iVar4 * (iVar12 - hint));
              do {
                *pdVar7 = pdVar7[(int)(iVar4 * hint)];
                pdVar7 = pdVar7 + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
            iVar4 = ON_KnotCount(order,iVar12);
            uVar10 = (ulong)(iVar4 - hint);
            if (iVar4 - hint != 0 && (int)hint <= iVar4) {
              pdVar7 = this->m_knot;
              do {
                *pdVar7 = pdVar7[hint];
                pdVar7 = pdVar7 + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
            this->m_cv_count = iVar12 - hint;
          }
          auVar2 = _DAT_0069b120;
          if (1 < (int)order) {
            pdVar7 = this->m_knot;
            lVar8 = (ulong)order - 2;
            auVar14._8_4_ = (int)lVar8;
            auVar14._0_8_ = lVar8;
            auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
            lVar8 = 0;
            auVar14 = auVar14 ^ _DAT_0069b120;
            auVar15 = _DAT_0069b170;
            do {
              auVar13 = auVar15 ^ auVar2;
              if ((bool)(~(auVar13._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar13._0_4_ ||
                          auVar14._4_4_ < auVar13._4_4_) & 1)) {
                *(double *)((long)pdVar7 + lVar8) = dVar1;
              }
              if ((auVar13._12_4_ != auVar14._12_4_ || auVar13._8_4_ <= auVar14._8_4_) &&
                  auVar13._12_4_ <= auVar14._12_4_) {
                *(double *)((long)pdVar7 + lVar8 + 8) = dVar1;
              }
              lVar9 = auVar15._8_8_;
              auVar15._0_8_ = auVar15._0_8_ + 2;
              auVar15._8_8_ = lVar9 + 2;
              lVar8 = lVar8 + 0x10;
            } while ((ulong)(order >> 1 & 0x3fffffff) << 4 != lVar8);
          }
          ClampEnd(this,2);
          ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
          return true;
        }
        iVar12 = 0xbec;
      }
      else {
        iVar12 = 0xbd7;
      }
      bVar11 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                 ,iVar12,"","ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    }
  }
  return bVar11;
}

Assistant:

bool ON_NurbsCurve::Trim( const ON_Interval& in )
{
  if ( !in.IsIncreasing() )
    return false;

  const int cv_dim = CVSize();
  const int order = Order();
  double t, split_t;
  int ki, side, i0, i1, i1_max, new_cv_count;

	//Greg Arden 28 April 2003.  Do not change any curve that is trimmed to its entire domain.
	//             This is especially important for periodic curves.
	if(in==Domain())
	  return true;


  DestroyCurveTree();

  // cut off right end (or extend if in.m_t[1] > Domain.Max()
  side = -1;
  t = in.m_t[1]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if ( TweakSplitTrimParameter(m_knot[ki+order-2], m_knot[ki+order-1], split_t ) )
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }
  // clamp right end knots
  m_cv_count = ki + order;
  for ( i0 = ON_KnotCount( order, m_cv_count)-1; i0 >= m_cv_count-1; i0--)
    m_knot[i0] = t;

  // cut off left end (or extend if in.m_t[0] < Domain.Max()
  side = 1;
  t = in.m_t[0]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if (TweakSplitTrimParameter(m_knot[ki + order - 2], m_knot[ki + order - 1], split_t))
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }

  // remove surplus cvs and knots
  new_cv_count = m_cv_count - ki;
  if ( new_cv_count < m_cv_count ) {
    // move cvs and knots over
    i1_max = m_cv_stride*m_cv_count;
    for ( i0 = 0, i1 = ki*m_cv_stride; i1 < i1_max; i0++, i1++ )
      m_cv[i0] = m_cv[i1];
    i1_max = ON_KnotCount( order, m_cv_count );
    for ( i0 = 0, i1 = ki; i1 < i1_max; i0++, i1++ )
      m_knot[i0] = m_knot[i1];
    m_cv_count = new_cv_count;
  }

  // clamp left end knots
  for (i0 = 0; i0 <= order-2; i0++)
    m_knot[i0] = t;

  ClampEnd(2); // 26 June 2003 Dale Lear

	DestroyCurveTree();
  return true;
}